

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>
                   (appender out,big_decimal_fp *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,char decimal_point)

{
  bool bVar1;
  type tVar2;
  appender *paVar3;
  bool local_191;
  int local_190;
  int local_18c;
  char local_185;
  int local_184;
  anon_class_48_6_d9b5e731 local_180;
  float_specs local_150;
  bool local_145;
  int local_144;
  undefined1 auStack_140 [3];
  bool pointy;
  int num_zeros;
  char **local_138;
  int *local_130;
  int *local_128;
  char *local_120;
  int *local_118;
  float_specs local_110;
  int local_104;
  undefined1 auStack_100 [4];
  int num_zeros_3;
  char **local_f8;
  int *local_f0;
  basic_format_specs<char> *local_e8;
  float_specs *local_e0;
  char *local_d8;
  int *local_d0;
  float_specs local_c8;
  int local_c0;
  int local_bc;
  int num_zeros_2;
  int exp;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_b0;
  float_specs local_a8;
  float_specs local_a0;
  undefined1 local_98 [8];
  anon_class_40_7_ef14d3db write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  size_t size;
  sign_t sign;
  int significand_size;
  char *significand;
  basic_format_specs<char> *pbStack_30;
  char decimal_point_local;
  basic_format_specs<char> *specs_local;
  big_decimal_fp *fp_local;
  float_specs fspecs_local;
  appender out_local;
  
  _sign = fp->significand;
  significand._7_1_ = decimal_point;
  pbStack_30 = specs;
  specs_local = (basic_format_specs<char> *)fp;
  fp_local = (big_decimal_fp *)fspecs;
  fspecs_local = (float_specs)
                 out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  size._4_4_ = get_significand_size(fp);
  size._0_4_ = fp_local._4_4_ >> 8 & 0xff;
  tVar2 = to_unsigned<int>(size._4_4_);
  register0x00000000 = (size_t)(tVar2 + ((sign_t)size != none));
  use_exp_format.fspecs.precision = *(int *)((specs_local->fill).data_ + 1) + size._4_4_ + -1;
  _abs_output_exp = (float_specs)fp_local;
  use_exp_format.fspecs._4_4_ = use_exp_format.fspecs.precision;
  bVar1 = write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char>::
          anon_class_12_2_f0c9b3c6::operator()((anon_class_12_2_f0c9b3c6 *)&abs_output_exp);
  if (bVar1) {
    exp_digits = 0;
    if ((fp_local._4_4_ >> 0x14 & 1) == 0) {
      if (size._4_4_ == 1) {
        significand._7_1_ = '\0';
      }
    }
    else {
      exp_digits = (int)fp_local - size._4_4_;
      if (exp_digits < 0) {
        exp_digits = 0;
      }
      tVar2 = to_unsigned<int>(exp_digits);
      register0x00000000 = tVar2 + stack0xffffffffffffffb0;
    }
    if ((int)use_exp_format.fspecs._4_4_ < 0) {
      local_184 = -use_exp_format.fspecs._4_4_;
    }
    else {
      local_184 = use_exp_format.fspecs._4_4_;
    }
    write._36_4_ = 2;
    if ((99 < local_184) && (write._36_4_ = 3, 999 < local_184)) {
      write._36_4_ = 4;
    }
    tVar2 = to_unsigned<int>((significand._7_1_ != '\0') + 2 + write._36_4_);
    register0x00000000 = tVar2 + stack0xffffffffffffffb0;
    local_185 = 'E';
    if (((ulong)fp_local & 0x1000000000000) == 0) {
      local_185 = 'e';
    }
    write.output_exp._3_1_ = local_185;
    local_98._0_4_ = (sign_t)size;
    write._0_8_ = _sign;
    write.significand._0_4_ = size._4_4_;
    write.significand._4_1_ = significand._7_1_;
    write.significand_size = exp_digits;
    write.decimal_point = local_185;
    write.num_zeros = use_exp_format.fspecs._4_4_;
    if (pbStack_30->width < 1) {
      local_a8 = fspecs_local;
      paVar3 = reserve<fmt::v8::appender>((appender *)&fspecs_local,register0x00000000);
      _num_zeros_2 = (paVar3->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      local_b0.container =
           (buffer<char> *)
           write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char>::
           anon_class_40_7_ef14d3db::operator()((anon_class_40_7_ef14d3db *)local_98,_num_zeros_2);
      out_local = base_iterator<fmt::v8::appender>((appender)local_a8,(appender)local_b0.container);
    }
    else {
      local_a0 = fspecs_local;
      out_local = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_1_&>
                            ((appender)fspecs_local,pbStack_30,register0x00000000,
                             (anon_class_40_7_ef14d3db *)local_98);
    }
  }
  else {
    local_bc = *(int *)((specs_local->fill).data_ + 1) + size._4_4_;
    if (*(int *)((specs_local->fill).data_ + 1) < 0) {
      if (local_bc < 1) {
        local_144 = -local_bc;
        if (((size._4_4_ == 0) && (-1 < (int)fp_local)) && ((int)fp_local < local_144)) {
          local_144 = (int)fp_local;
        }
        local_191 = true;
        if ((local_144 == 0) && (local_191 = true, size._4_4_ == 0)) {
          local_191 = (bool)((byte)(fp_local._4_4_ >> 0x14) & 1);
        }
        local_145 = local_191;
        tVar2 = to_unsigned<int>(local_144);
        register0x00000000 = ((local_191 != false) + 1 + tVar2) + stack0xffffffffffffffb0;
        local_150 = fspecs_local;
        local_180.sign = (sign_t *)&size;
        local_180.pointy = &local_145;
        local_180.decimal_point = (char *)((long)&significand + 7);
        local_180.num_zeros = &local_144;
        local_180.significand = (char **)&sign;
        local_180.significand_size = (int *)((long)&size + 4);
        out_local = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_4_>
                              ((appender)fspecs_local,pbStack_30,register0x00000000,&local_180);
      }
      else {
        if ((fp_local._4_4_ >> 0x14 & 1) == 0) {
          local_18c = 0;
        }
        else {
          local_18c = (int)fp_local - size._4_4_;
        }
        local_104 = local_18c;
        if (local_18c < 1) {
          local_190 = 0;
        }
        else {
          local_190 = local_18c;
        }
        tVar2 = to_unsigned<int>(local_190);
        register0x00000000 = (tVar2 + 1) + stack0xffffffffffffffb0;
        local_110 = fspecs_local;
        _auStack_140 = (sign_t *)&size;
        local_138 = (char **)&sign;
        local_130 = (int *)((long)&size + 4);
        local_128 = &local_bc;
        local_120 = (char *)((long)&significand + 7);
        local_118 = &local_104;
        out_local = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_3_>
                              ((appender)fspecs_local,pbStack_30,register0x00000000,
                               (anon_class_48_6_48d028d1 *)auStack_140);
      }
    }
    else {
      tVar2 = to_unsigned<int>(*(int *)((specs_local->fill).data_ + 1));
      register0x00000000 = tVar2 + stack0xffffffffffffffb0;
      local_c0 = (int)fp_local - local_bc;
      if ((fp_local._4_4_ >> 0x14 & 1) != 0) {
        if ((local_c0 < 1) && ((char)((ulong)fp_local >> 0x20) != '\x02')) {
          local_c0 = 1;
        }
        if (0 < local_c0) {
          tVar2 = to_unsigned<int>(local_c0);
          register0x00000000 = (tVar2 + 1) + stack0xffffffffffffffb0;
        }
      }
      local_c8 = fspecs_local;
      _auStack_100 = (sign_t *)&size;
      local_f8 = (char **)&sign;
      local_f0 = (int *)((long)&size + 4);
      local_e8 = specs_local;
      local_e0 = (float_specs *)&fp_local;
      local_d8 = (char *)((long)&significand + 7);
      local_d0 = &local_c0;
      out_local = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_2_>
                            ((appender)fspecs_local,pbStack_30,stack0xffffffffffffffb0,
                             (anon_class_56_7_a2a26a24 *)auStack_100);
    }
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 Char decimal_point) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = detail::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}